

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O1

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)

{
  FAudio_OPERATIONSET_Type FVar1;
  FAudio *pFVar2;
  FAudio_OPERATIONSET_Operation *pFVar3;
  FAudioFreeFunc p_Var4;
  FAudio_OPERATIONSET_Operation **ppFVar5;
  long lVar6;
  FAudio_OPERATIONSET_Operation *pFVar7;
  FAudio_OPERATIONSET_Operation *pFVar8;
  bool bVar9;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar2 = voice->audio;
  pFVar8 = pFVar2->queuedOperations;
  if (pFVar8 != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar7 = (FAudio_OPERATIONSET_Operation *)0x0;
    do {
      FVar1 = pFVar8->Type;
      if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
        bVar9 = (pFVar8->Data).SetOutputFilterParameters.pDestinationVoice == voice;
      }
      else if ((FVar1 == FAUDIOOP_SETOUTPUTFILTERPARAMETERS) &&
              ((pFVar8->Data).SetOutputFilterParameters.pDestinationVoice == voice)) {
        bVar9 = true;
      }
      else {
        bVar9 = false;
      }
      pFVar3 = pFVar8->next;
      if ((pFVar8->Voice == voice) || (bVar9)) {
        ppFVar5 = &pFVar7->next;
        if (pFVar7 == (FAudio_OPERATIONSET_Operation *)0x0) {
          ppFVar5 = &pFVar2->queuedOperations;
        }
        *ppFVar5 = pFVar3;
        p_Var4 = voice->audio->pFree;
        lVar6 = 0x18;
        if ((FVar1 == FAUDIOOP_SETEFFECTPARAMETERS) || (FVar1 == FAUDIOOP_SETCHANNELVOLUMES)) {
LAB_0011ca52:
          (*p_Var4)(*(void **)((long)&pFVar8->Type + lVar6));
        }
        else if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
          lVar6 = 0x20;
          goto LAB_0011ca52;
        }
        (*p_Var4)(pFVar8);
        pFVar8 = pFVar7;
      }
      pFVar7 = pFVar8;
      pFVar8 = pFVar3;
    } while (pFVar3 != (FAudio_OPERATIONSET_Operation *)0x0);
  }
  pFVar2 = voice->audio;
  pFVar8 = pFVar2->committedOperations;
  if (pFVar8 != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFVar7 = (FAudio_OPERATIONSET_Operation *)0x0;
    do {
      FVar1 = pFVar8->Type;
      if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
        bVar9 = (pFVar8->Data).SetOutputFilterParameters.pDestinationVoice == voice;
      }
      else if ((FVar1 == FAUDIOOP_SETOUTPUTFILTERPARAMETERS) &&
              ((pFVar8->Data).SetOutputFilterParameters.pDestinationVoice == voice)) {
        bVar9 = true;
      }
      else {
        bVar9 = false;
      }
      pFVar3 = pFVar8->next;
      if ((pFVar8->Voice == voice) || (bVar9)) {
        ppFVar5 = &pFVar7->next;
        if (pFVar7 == (FAudio_OPERATIONSET_Operation *)0x0) {
          ppFVar5 = &pFVar2->committedOperations;
        }
        *ppFVar5 = pFVar3;
        p_Var4 = voice->audio->pFree;
        lVar6 = 0x18;
        if ((FVar1 == FAUDIOOP_SETEFFECTPARAMETERS) || (FVar1 == FAUDIOOP_SETCHANNELVOLUMES)) {
LAB_0011caeb:
          (*p_Var4)(*(void **)((long)&pFVar8->Type + lVar6));
        }
        else if (FVar1 == FAUDIOOP_SETOUTPUTMATRIX) {
          lVar6 = 0x20;
          goto LAB_0011caeb;
        }
        (*p_Var4)(pFVar8);
        pFVar8 = pFVar7;
      }
      pFVar7 = pFVar8;
      pFVar8 = pFVar3;
    } while (pFVar3 != (FAudio_OPERATIONSET_Operation *)0x0);
  }
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_ClearAllForVoice(FAudioVoice *voice)
{
	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	RemoveFromList(voice, &voice->audio->queuedOperations);
	RemoveFromList(voice, &voice->audio->committedOperations);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}